

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O2

void __thiscall
llvm::DWARFDie::attribute_iterator::attribute_iterator(attribute_iterator *this,DWARFDie D,bool End)

{
  DWARFAbbreviationDeclaration *AbbrDecl;
  uint64_t uVar1;
  undefined1 local_30 [8];
  DWARFDie D_local;
  
  D_local.U = (DWARFUnit *)D.Die;
  local_30 = (undefined1  [8])D.U;
  (this->Die).U = (DWARFUnit *)local_30;
  (this->Die).Die = (DWARFDebugInfoEntry *)D_local.U;
  (this->AttrValue).Offset = 0;
  (this->AttrValue).ByteSize = 0;
  (this->AttrValue).Attr = 0;
  (this->AttrValue).Value.Form = 0;
  (this->AttrValue).Value.Value.field_0.uval = 0;
  (this->AttrValue).Value.Value.data = (uint8_t *)0x0;
  (this->AttrValue).Value.U = (DWARFUnit *)0x0;
  (this->AttrValue).Value.C = (DWARFContext *)0x0;
  this->Index = 0;
  AbbrDecl = getAbbreviationDeclarationPtr(&this->Die);
  if (AbbrDecl != (DWARFAbbreviationDeclaration *)0x0) {
    if (End) {
      this->Index = (AbbrDecl->AttributeSpecs).
                    super_SmallVectorImpl<llvm::DWARFAbbreviationDeclaration::AttributeSpec>.
                    super_SmallVectorTemplateBase<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_true>
                    .
                    super_SmallVectorTemplateCommon<llvm::DWARFAbbreviationDeclaration::AttributeSpec,_void>
                    .super_SmallVectorBase.Size;
    }
    else {
      uVar1 = getOffset((DWARFDie *)local_30);
      (this->AttrValue).Offset = AbbrDecl->CodeByteSize + uVar1;
      updateForIndex(this,AbbrDecl,0);
    }
    return;
  }
  __assert_fail("AbbrDecl && \"Must have abbreviation declaration\"",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDie.cpp"
                ,0x2a2,"llvm::DWARFDie::attribute_iterator::attribute_iterator(DWARFDie, bool)");
}

Assistant:

DWARFDie::attribute_iterator::attribute_iterator(DWARFDie D, bool End)
    : Die(D), Index(0) {
  auto AbbrDecl = Die.getAbbreviationDeclarationPtr();
  assert(AbbrDecl && "Must have abbreviation declaration");
  if (End) {
    // This is the end iterator so we set the index to the attribute count.
    Index = AbbrDecl->getNumAttributes();
  } else {
    // This is the begin iterator so we extract the value for this->Index.
    AttrValue.Offset = D.getOffset() + AbbrDecl->getCodeByteSize();
    updateForIndex(*AbbrDecl, 0);
  }
}